

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void text_drawborder(t_text *x,_glist *glist,char *tag,int width2,int height2,int firsttime)

{
  uint uVar1;
  byte bVar2;
  _glist *p_Var3;
  _glist *x_00;
  _glist *extraout_RAX;
  _glist *x_01;
  _glist *x_02;
  int iVar4;
  undefined4 in_register_0000000c;
  t_text *ptVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 in_register_00000084;
  t_text *ptVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  int y2;
  int x2;
  int y1;
  char *local_100;
  int x1;
  ulong local_f0;
  ulong local_e8;
  t_text *local_e0;
  char *tags [2];
  char tagR [128];
  
  sprintf(tagR,"%sR",tag,CONCAT44(in_register_0000000c,width2),
          CONCAT44(in_register_00000084,height2));
  text_getrect(&x->te_g,glist,&x1,&y1,&x2,&y2);
  iVar4 = y1;
  iVar13 = y2;
  bVar2 = x->field_0x2e & 3;
  switch(bVar2) {
  case 1:
    pcVar16 = "\"\"";
    if ((x->te_g).g_pd == text_class) {
      pcVar16 = "-";
    }
    tags[1] = "obj";
    local_100 = tag;
    tags[0] = tagR;
    p_Var3 = glist_getcanvas((_glist *)0x1b37a0);
    uVar6 = (ulong)(uint)x1;
    uVar7 = (ulong)(uint)y1;
    uVar9 = (ulong)(uint)x2;
    uVar10 = (ulong)(uint)y2;
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiii",p_Var3,"coords",tagR,uVar6,uVar7,uVar9,uVar7,uVar9,
                  uVar10,uVar6,uVar10,uVar6,uVar7);
      p_Var3 = glist_getcanvas(x_00);
      pdgui_vmess((char *)0x0,"crs rr",p_Var3,"itemconfigure",tagR,"-dash",pcVar16);
      pcVar16 = local_100;
    }
    else {
      local_f0 = (ulong)(uint)glist->gl_zoom;
      pdgui_vmess((char *)0x0,"crr iiiiiiiiii rr ri rr rS",p_Var3,"create","line",uVar6,uVar7,uVar9,
                  uVar7,uVar9,uVar10,uVar6,uVar10,uVar6,uVar7,"-dash",pcVar16,"-width",local_f0,
                  "-capstyle","projecting","-tags",2,tags);
      pcVar16 = local_100;
    }
    break;
  case 2:
    uVar14 = (ulong)(uint)y2;
    uVar6 = (ulong)(uint)y1;
    iVar12 = y2 - y1;
    iVar15 = iVar12 + 3;
    if (-1 < iVar12) {
      iVar15 = iVar12;
    }
    tags[1] = "msg";
    uVar17 = iVar15 >> 2;
    uVar1 = glist->gl_zoom * 10;
    if (SBORROW4(uVar17,uVar1) == (int)(uVar17 + glist->gl_zoom * -10) < 0) {
      uVar17 = uVar1;
    }
    local_100 = tag;
    tags[0] = tagR;
    p_Var3 = glist_getcanvas((_glist *)(ulong)uVar1);
    uVar10 = (ulong)(uint)x2;
    uVar9 = (ulong)(x2 + uVar17);
    uVar7 = (ulong)(iVar13 - uVar17);
    uVar11 = (ulong)(uVar17 + iVar4);
    ptVar8 = (t_text *)(ulong)(uint)x1;
    local_f0 = CONCAT44(local_f0._4_4_,firsttime);
    if (firsttime == 0) {
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var3,"coords",tagR,ptVar8,uVar6,uVar9,uVar6,
                  uVar10,uVar11,uVar10,uVar7,uVar9,uVar14,ptVar8,uVar14,ptVar8,uVar6);
    }
    else {
      ptVar5 = (t_text *)(ulong)(uint)glist->gl_zoom;
      local_e8 = uVar9;
      local_e0 = ptVar5;
LAB_00160c62:
      pdgui_vmess((char *)0x0,"crr iiiiiiiiiiiiii ri rr rS",p_Var3,"create","line",ptVar8,uVar6,
                  uVar9,uVar6,uVar10,uVar11,uVar10,uVar7,uVar9,(ulong)(uint)iVar13,ptVar8,
                  (ulong)(uint)iVar13,ptVar8,uVar6,"-width",ptVar5,"-capstyle","projecting","-tags",
                  2,tags);
    }
LAB_00160fc7:
    pcVar16 = local_100;
    firsttime = (int)local_f0;
    break;
  case 3:
    if (*(int *)&x[1].te_g.g_pd - 1U < 2) {
      iVar15 = (*(uint *)&x[2].te_outlet >> 3 & 1) * glist->gl_zoom;
      uVar7 = (ulong)(uint)(x1 + iVar15);
      uVar17 = iVar15 + y1;
      uVar9 = (ulong)uVar17;
      tags[1] = "atom";
      uVar6 = (ulong)(uint)y2;
      iVar4 = y2 - y1;
      iVar13 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar13 = iVar4;
      }
      local_100 = tag;
      local_e0 = x;
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)(ulong)(uint)y1);
      uVar11 = (ulong)(uint)x2;
      uVar10 = (ulong)(uint)(x2 - (iVar13 >> 2));
      uVar14 = (ulong)((iVar13 >> 2) + uVar17);
      local_f0 = CONCAT44(local_f0._4_4_,firsttime);
      local_e8 = uVar9;
      if (firsttime == 0) {
        pdgui_vmess((char *)0x0,"crs iiiiiiiiiiii",p_Var3,"coords",tagR,uVar7,uVar9,uVar10,uVar9,
                    uVar11,uVar14,uVar11,uVar6,uVar7,uVar6,uVar7,uVar9);
        p_Var3 = glist_getcanvas(x_01);
        pdgui_vmess((char *)0x0,"crs ri",p_Var3,"itemconfigure",tagR,"-width",
                    (ulong)(uint)(iVar15 + glist->gl_zoom));
      }
      else {
        pdgui_vmess((char *)0x0,"crr iiiiiiiiiiii ri rr rS",p_Var3,"create","line",uVar7,uVar9,
                    uVar10,uVar9,uVar11,uVar14,uVar11,uVar6,uVar7,uVar6,uVar7,uVar9,"-width",
                    (ulong)(uint)(iVar15 + glist->gl_zoom),"-capstyle","projecting","-tags",2,tags);
      }
      pcVar16 = local_100;
      x = local_e0;
      firsttime = (int)local_f0;
      break;
    }
    if (bVar2 != 0) {
      pcVar16 = tag;
      firsttime = firsttime;
      if (bVar2 != 3) break;
      iVar12 = (*(uint *)&x[2].te_outlet >> 3 & 1) * glist->gl_zoom;
      local_e0 = (t_text *)(ulong)(uint)(x1 + iVar12);
      local_e8 = (ulong)(uint)(iVar12 + y1);
      tags[1] = "atom";
      uVar6 = (ulong)(uint)y2;
      iVar15 = y2 - y1;
      iVar4 = iVar15 + 3;
      if (-1 < iVar15) {
        iVar4 = iVar15;
      }
      iVar4 = iVar4 >> 2;
      local_100 = tag;
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)(ulong)(uint)y1);
      uVar10 = (ulong)(uint)x2;
      uVar9 = (ulong)(uint)(x2 - iVar4);
      uVar7 = (ulong)(uint)(iVar13 - iVar4);
      uVar11 = (ulong)(uint)(iVar4 + (int)local_e8);
      local_f0 = CONCAT44(local_f0._4_4_,firsttime);
      if (firsttime != 0) {
        ptVar5 = (t_text *)(ulong)(uint)(iVar12 + glist->gl_zoom);
        ptVar8 = local_e0;
        uVar6 = local_e8;
        goto LAB_00160c62;
      }
      pdgui_vmess((char *)0x0,"crs iiiiiiiiiiiiii",p_Var3,"coords",tagR,local_e0,local_e8,uVar9,
                  local_e8,uVar10,uVar11,uVar10,uVar7,uVar9,uVar6,local_e0,uVar6,local_e0,local_e8);
      p_Var3 = glist_getcanvas(x_02);
      pdgui_vmess((char *)0x0,"crs ri",p_Var3,"itemconfigure",tagR,"-width",
                  (ulong)(uint)(iVar12 + glist->gl_zoom));
      goto LAB_00160fc7;
    }
  case 0:
    pcVar16 = tag;
    firsttime = firsttime;
    if ((glist->field_0xe8 & 0x20) != 0) {
      tags[1] = "commentbar";
      tags[0] = tagR;
      p_Var3 = glist_getcanvas((_glist *)"commentbar");
      uVar6 = (ulong)(uint)x2;
      if (firsttime == 0) {
        pdgui_vmess((char *)0x0,"crs iiii",p_Var3,"coords",tagR,uVar6,(ulong)(uint)y1,uVar6,
                    (ulong)(uint)y2);
        pcVar16 = tag;
        firsttime = firsttime;
      }
      else {
        pdgui_vmess((char *)0x0,"crr iiii rS",p_Var3,"create","line",uVar6,(ulong)(uint)y1,uVar6,
                    (ulong)(uint)y2,"-tags",2,tags);
        pcVar16 = tag;
        firsttime = firsttime;
      }
    }
  }
  p_Var3 = (_glist *)pd_checkobject((t_pd *)x);
  if (p_Var3 != (_glist *)0x0) {
    glist_drawiofor(glist,(t_object *)p_Var3,firsttime,pcVar16,x1,y1,x2,y2);
    p_Var3 = extraout_RAX;
  }
  if (firsttime != 0) {
    p_Var3 = glist_getcanvas(p_Var3);
    pdgui_vmess((char *)0x0,"crr",p_Var3,"raise","cord");
  }
  return;
}

Assistant:

void text_drawborder(t_text *x, t_glist *glist,
    const char *tag, int width2, int height2, int firsttime)
{
    t_object *ob;
    int x1, y1, x2, y2, width, height, corner;
    char tagR[128];
    sprintf(tagR, "%sR", tag);
    text_getrect(&x->te_g, glist, &x1, &y1, &x2, &y2);
    width = x2 - x1;
    height = y2 - y1;
    if (x->te_type == T_OBJECT)
    {
        char *pattern = ((pd_class(&x->te_pd) == text_class) ? "-" : "\"\"");
        char *tags[] = {tagR, "obj"};
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiii rr ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1,
                "-dash", pattern,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2, y1,  x2, y2,  x1, y2,  x1, y1);
            pdgui_vmess(0, "crs rr",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-dash", pattern);
        }
    }
    else if (x->te_type == T_MESSAGE)
    {
        char *tags[] = {tagR, "msg"};
        corner = ((y2-y1)/4);
        if (corner > 10*glist->gl_zoom)
            corner = 10*glist->gl_zoom; /* looks bad if too big */
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1,
                "-width", glist->gl_zoom,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1, y1,  x2+corner, y1,  x2, y1+corner,  x2, y2-corner,  x2+corner, y2,  x1, y2,  x1, y1);
    }
    else if (x->te_type == T_ATOM && (((t_gatom *)x)->a_flavor == A_FLOAT ||
           ((t_gatom *)x)->a_flavor == A_SYMBOL))
    {
            /* number or symbol */
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist), "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner, x2, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2,  x1p, y2,  x1p, y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
    else if (x->te_type == T_ATOM ) /* list (ATOM but not float or symbol) */
    {
        int grabbed = glist->gl_zoom * ((t_gatom *)x)->a_grabbed;
        int x1p = x1 + grabbed, y1p = y1 + grabbed;
        char *tags[] = {tagR, "atom"};
        corner = ((y2-y1)/4);
        if (firsttime)
            pdgui_vmess(0, "crr iiiiiiiiiiiiii ri rr rS",
                glist_getcanvas(glist),
                "create", "line",
                x1p, y1p,  x2-corner, y1p,  x2, y1p+corner,  x2, y2-corner,  x2-corner, y2,  x1p, y2,  x1p, y1p,
                "-width", glist->gl_zoom+grabbed,
                "-capstyle", "projecting",
                "-tags", 2, tags);
        else
        {
            pdgui_vmess(0, "crs iiiiiiiiiiiiii",
                glist_getcanvas(glist), "coords", tagR,
                x1p,y1p, x2-corner,y1p, x2,y1p+corner, x2,y2-corner, x2-corner,y2, x1p,y2, x1p,y1p);
            pdgui_vmess(0, "crs ri",
                glist_getcanvas(glist), "itemconfigure", tagR,
                "-width", glist->gl_zoom+grabbed);
        }
    }
        /* for comments, just draw a bar on RHS if unlocked; when a visible
        canvas is unlocked we have to call this anew on all comments, and when
        locked we erase them all via the annoying "commentbar" tag. */
    else if (x->te_type == T_TEXT && glist->gl_edit)
    {
        char *tags[] = {tagR, "commentbar"};
        if (firsttime)
            pdgui_vmess(0, "crr iiii rS",
                glist_getcanvas(glist), "create", "line",
                x2, y1,  x2, y2,
                "-tags", 2, tags);
        else
            pdgui_vmess(0, "crs iiii",
                glist_getcanvas(glist), "coords", tagR,
                x2, y1,  x2, y2);
    }
        /* draw inlets/outlets */

    if ((ob = pd_checkobject(&x->te_pd)))
        glist_drawiofor(glist, ob, firsttime, tag, x1, y1, x2, y2);
    if (firsttime) /* raise cords over everything else */
        pdgui_vmess(0, "crr", glist_getcanvas(glist), "raise", "cord");
}